

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O2

void Imf_2_5::writeToRGBANormal
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **readPtrAlpha,unsigned_short **writePtr,
               size_t *lPixelsToCopy)

{
  unsigned_short uVar1;
  ulong uVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  
  uVar2 = *lPixelsToCopy;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    puVar3 = *readPtrRed;
    *readPtrRed = puVar3 + 1;
    uVar1 = *puVar3;
    puVar3 = *writePtr;
    *writePtr = puVar3 + 1;
    *puVar3 = uVar1;
    puVar3 = *readPtrGreen;
    *readPtrGreen = puVar3 + 1;
    uVar1 = *puVar3;
    puVar3 = *writePtr;
    *writePtr = puVar3 + 1;
    *puVar3 = uVar1;
    puVar3 = *readPtrBlue;
    *readPtrBlue = puVar3 + 1;
    uVar1 = *puVar3;
    puVar3 = *writePtr;
    *writePtr = puVar3 + 1;
    *puVar3 = uVar1;
    puVar3 = *readPtrAlpha;
    *readPtrAlpha = puVar3 + 1;
    uVar1 = *puVar3;
    puVar3 = *writePtr;
    *writePtr = puVar3 + 1;
    *puVar3 = uVar1;
  }
  return;
}

Assistant:

EXR_FORCEINLINE 
void writeToRGBANormal (unsigned short*& readPtrRed,
                        unsigned short*& readPtrGreen,
                        unsigned short*& readPtrBlue,
                        unsigned short*& readPtrAlpha,
                        unsigned short*& writePtr,
                        const size_t& lPixelsToCopy)
{
    for (size_t i = 0; i < lPixelsToCopy; ++i)
    {
        *(writePtr++) = *(readPtrRed++);
        *(writePtr++) = *(readPtrGreen++);
        *(writePtr++) = *(readPtrBlue++);
        *(writePtr++) = *(readPtrAlpha++);
    }
}